

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.c
# Opt level: O0

sexp_conflict sexp_get_environment_variables(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n)

{
  long in_RDI;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_conflict val;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_conflict name;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict res;
  char *cval;
  char *cname;
  char **env;
  int i;
  undefined8 *local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 *local_68;
  undefined8 local_60;
  undefined8 local_58;
  sexp_conflict *local_50;
  undefined8 local_48;
  sexp_conflict local_40;
  char *local_38;
  char *local_30;
  long local_28;
  int local_1c;
  long local_8;
  
  local_40 = (sexp_conflict)0x43e;
  local_8 = in_RDI;
  memset(&local_50,0,0x10);
  local_58 = 0x43e;
  memset(&local_68,0,0x10);
  local_70 = 0x43e;
  memset(&local_80,0,0x10);
  local_50 = &local_40;
  local_48 = *(undefined8 *)(local_8 + 0x6080);
  *(sexp_conflict ***)(local_8 + 0x6080) = &local_50;
  local_68 = &local_58;
  local_60 = *(undefined8 *)(local_8 + 0x6080);
  *(undefined8 ***)(local_8 + 0x6080) = &local_68;
  local_80 = &local_70;
  local_78 = *(undefined8 *)(local_8 + 0x6080);
  *(undefined8 ***)(local_8 + 0x6080) = &local_80;
  local_40 = (sexp_conflict)0x23e;
  local_28 = _environ;
  local_1c = 0;
  while (*(long *)(local_28 + (long)local_1c * 8) != 0) {
    local_30 = *(char **)(local_28 + (long)local_1c * 8);
    local_38 = strchr(local_30,0x3d);
    if (local_38 != (char *)0x0) {
      local_58 = sexp_c_string(local_8,local_30,(long)local_38 - (long)local_30);
      local_70 = sexp_c_string(local_8,local_38 + 1,0xffffffffffffffff);
      local_70 = sexp_cons_op(local_8,0,2,local_58,local_70);
      local_40 = (sexp_conflict)sexp_cons_op(local_8,0,2,local_70,local_40);
    }
    local_1c = local_1c + 1;
  }
  *(undefined8 *)(local_8 + 0x6080) = local_48;
  return local_40;
}

Assistant:

sexp sexp_get_environment_variables (sexp ctx, sexp self, sexp_sint_t n) {
  int i;
  char **env, *cname, *cval;
  sexp_gc_var3(res, name, val);
  sexp_gc_preserve3(ctx, res, name, val);
  res = SEXP_NULL;
#ifndef PLAN9
  env = environ;
  for (i=0; env[i]; i++) {
    cname = env[i];
    cval = strchr(cname, '=');
    if (cval) {
      name = sexp_c_string(ctx, cname, cval-cname);
      val = sexp_c_string(ctx, cval+1, -1);
      val = sexp_cons(ctx, name, val);
      res = sexp_cons(ctx, val, res);
    }
  }
#endif
  sexp_gc_release3(ctx);
  return res;
}